

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_putters.c
# Opt level: O1

int qc_putterschain_remove(QcPuttersChain *putterChain,QcPutter *putter)

{
  int iVar1;
  undefined8 *__ptr;
  QcList *pQVar2;
  undefined8 *__ptr_00;
  
  if ((putterChain != (QcPuttersChain *)0x0) && (putter != (QcPutter *)0x0)) {
    qc_thread_wrlock_lock(putterChain->rwlock);
    if (putter->_entry == (QcListEntry *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = qc_list_removeentry(putterChain->putBuckets[(long)putter->priority + -1]->puttersChain
                                  ,putter->_entry);
      if (iVar1 != 0) goto LAB_0010a8bf;
      putterChain->putter_count = putterChain->putter_count + -1;
      iVar1 = 0;
    }
    qc_thread_wrlock_unlock(putterChain->rwlock);
    return iVar1;
  }
  qc_putterschain_remove_cold_1();
LAB_0010a8bf:
  qc_putterschain_remove_cold_2();
  __ptr_00 = (undefined8 *)0x10;
  __ptr = (undefined8 *)malloc(0x10);
  if (__ptr != (undefined8 *)0x0) {
    *__ptr = 0;
    __ptr[1] = 0;
    pQVar2 = qc_list_create(0);
    if (pQVar2 == (QcList *)0x0) {
      free(__ptr);
      __ptr = (undefined8 *)0x0;
    }
    else {
      *__ptr = pQVar2;
    }
    return (int)__ptr;
  }
  qc_msgbucket_create_cold_1();
  if (__ptr_00 != (undefined8 *)0x0) {
    if ((QcList *)*__ptr_00 != (QcList *)0x0) {
      qc_list_destroy((QcList *)*__ptr_00);
    }
    free(__ptr_00);
    return 0;
  }
  return -1;
}

Assistant:

int qc_putterschain_remove(QcPuttersChain *putterChain, QcPutter *putter) {
	qc_assert(NULL != putterChain && NULL != putter);

	qc_thread_wrlock_lock(putterChain->rwlock);
	int bucket_sn = putter->priority - 1;

	if(putter->_entry == NULL){  //null if putter is popped
		qc_thread_wrlock_unlock(putterChain->rwlock);
		return -1;
	}
	int ret = qc_list_removeentry(putterChain->putBuckets[bucket_sn]->puttersChain, putter->_entry);
	qc_assert(ret == 0);

	putterChain->putter_count--;
	qc_thread_wrlock_unlock(putterChain->rwlock);
	return 0;
}